

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O2

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_mixed,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>>>>
::
produce<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>,std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
          (interpreter<mvm::test::test_instr_set_mixed,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<double,unsigned_int>>>>>
           *this,vector<double,_std::allocator<double>_> *arg)

{
  pointer pdVar1;
  pointer pdVar2;
  double sub;
  double local_28;
  
  pdVar1 = (arg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (arg->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    local_28 = *pdVar2;
    value_stack<mvm::list::mplist<double,_unsigned_int>_>::push<double>
              ((value_stack<mvm::list::mplist<double,_unsigned_int>_> *)(this + 8),&local_28);
  }
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce(T &&arg) {
  if constexpr (concept ::is_tuple_v<std::decay_t<T>>) {
    this->produce_unroll<IS>(
        std::forward<T>(arg),
        std::make_index_sequence<std::tuple_size<T>::value>());
  } else if constexpr (concept ::is_container_valid_v<std::decay_t<T>>) {
    for (auto sub : std::forward<T>(arg)) {
      std::get<IS>(m_instances)
          .template push<typename V::value_type>(std::move(sub));
    }
  } else {
    std::get<IS>(m_instances).template push<V>(std::forward<T>(arg));
  }
}